

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetUInt32
          (OptionInterpreter *this,int number,uint32 value,Type type,UnknownFieldSet *unknown_fields
          )

{
  LogMessage *other;
  int in_ECX;
  int in_stack_0000000c;
  LogMessage *in_stack_00000010;
  char *in_stack_ffffffffffffff78;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff88;
  LogLevel level;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  UnknownFieldSet *in_stack_ffffffffffffffa0;
  LogMessage local_58;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_ECX == 7) {
    UnknownFieldSet::AddFixed32
              ((UnknownFieldSet *)CONCAT44(7,in_stack_ffffffffffffff90),level,
               (uint32)in_stack_ffffffffffffff88);
  }
  else if (in_ECX == 0xd) {
    UnknownFieldSet::AddVarint
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               CONCAT44(0xd,in_stack_ffffffffffffff90));
  }
  else {
    this_00 = &local_58;
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_ECX,in_stack_ffffffffffffff90),level,(char *)this_00,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    internal::LogMessage::operator<<(this_00,in_stack_ffffffffffffff78);
    other = internal::LogMessage::operator<<(in_stack_00000010,in_stack_0000000c);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x643f10);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetUInt32(
    int number, uint32 value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_UINT32:
      unknown_fields->AddVarint(number, static_cast<uint64>(value));
      break;

    case FieldDescriptor::TYPE_FIXED32:
      unknown_fields->AddFixed32(number, static_cast<uint32>(value));
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_UINT32: " << type;
      break;
  }
}